

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O2

int CVBBDPrecInit(void *cvode_mem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                 sunindextype mukeep,sunindextype mlkeep,sunrealtype dqrely,CVLocalFn gloc,
                 CVCommFn cfn)

{
  double __x;
  long lVar1;
  long N;
  int iVar2;
  long *__ptr;
  SUNMatrix p_Var3;
  N_Vector p_Var4;
  long lVar5;
  SUNLinearSolver p_Var6;
  long smu;
  int line;
  char *msgfmt;
  sunrealtype sVar7;
  long liw;
  long lrw;
  sunrealtype local_50;
  long local_48;
  sunindextype liw1;
  sunindextype lrw1;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar2 = -1;
    line = 0x45;
    cvode_mem = (CVodeMem)0x0;
  }
  else {
    lVar1 = *(long *)((long)cvode_mem + 0x410);
    if (lVar1 == 0) {
      msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
      iVar2 = -2;
      line = 0x4e;
    }
    else if (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0xe0) + 8) + 0x28) == 0) {
      msgfmt = "A required vector operation is not implemented.";
      iVar2 = -3;
      line = 0x57;
    }
    else {
      local_50 = dqrely;
      local_48 = Nlocal;
      __ptr = (long *)malloc(0xa0);
      N = local_48;
      if (__ptr == (long *)0x0) {
        msgfmt = "A memory request failed.";
        iVar2 = -4;
        line = 0x61;
      }
      else {
        lVar5 = 0;
        if (mudq < 1) {
          mudq = lVar5;
        }
        smu = local_48 + -1;
        if (local_48 <= mudq) {
          mudq = smu;
        }
        if (mldq < 1) {
          mldq = lVar5;
        }
        __ptr[0x13] = (long)cvode_mem;
        if (local_48 <= mldq) {
          mldq = smu;
        }
        __ptr[5] = (long)gloc;
        if (mukeep < 1) {
          mukeep = lVar5;
        }
        if (local_48 <= mukeep) {
          mukeep = smu;
        }
        __ptr[6] = (long)cfn;
        if (0 < mlkeep) {
          lVar5 = mlkeep;
        }
        *__ptr = mudq;
        if (local_48 <= lVar5) {
          lVar5 = smu;
        }
        __ptr[1] = mldq;
        __ptr[2] = mukeep;
        __ptr[3] = lVar5;
        p_Var3 = SUNBandMatrixStorage(local_48,mukeep,lVar5,mukeep,*cvode_mem);
        __ptr[7] = (long)p_Var3;
        if (p_Var3 == (SUNMatrix)0x0) {
          free(__ptr);
          msgfmt = "A memory request failed.";
          iVar2 = -4;
          line = 0x77;
        }
        else {
          if (lVar5 + mukeep < N) {
            smu = lVar5 + mukeep;
          }
          __ptr[8] = 0;
          p_Var3 = SUNBandMatrixStorage(N,mukeep,lVar5,smu,*cvode_mem);
          __ptr[8] = (long)p_Var3;
          if (p_Var3 == (SUNMatrix)0x0) {
            SUNMatDestroy(__ptr[7]);
            free(__ptr);
            msgfmt = "A memory request failed.";
            iVar2 = -4;
            line = 0x86;
          }
          else {
            __ptr[0xd] = 0;
            p_Var4 = N_VNewEmpty_Serial(N,*cvode_mem);
            __ptr[0xd] = (long)p_Var4;
            if (p_Var4 == (N_Vector)0x0) {
              SUNMatDestroy(__ptr[8]);
              SUNMatDestroy(__ptr[7]);
              free(__ptr);
              msgfmt = "A memory request failed.";
              iVar2 = -4;
              line = 0x94;
            }
            else {
              __ptr[0xe] = 0;
              p_Var4 = N_VNewEmpty_Serial(N,*cvode_mem);
              __ptr[0xe] = (long)p_Var4;
              if (p_Var4 == (N_Vector)0x0) {
                N_VDestroy(__ptr[0xd]);
                SUNMatDestroy(__ptr[8]);
                SUNMatDestroy(__ptr[7]);
                free(__ptr);
                msgfmt = "A memory request failed.";
                iVar2 = -4;
                line = 0xa1;
              }
              else {
                __ptr[10] = 0;
                lVar5 = N_VClone(*(undefined8 *)((long)cvode_mem + 0xe0));
                __ptr[10] = lVar5;
                if (lVar5 == 0) {
                  N_VDestroy(__ptr[0xd]);
                  N_VDestroy(__ptr[0xe]);
                  SUNMatDestroy(__ptr[8]);
                  SUNMatDestroy(__ptr[7]);
                  free(__ptr);
                  msgfmt = "A memory request failed.";
                  iVar2 = -4;
                  line = 0xaf;
                }
                else {
                  __ptr[0xb] = 0;
                  lVar5 = N_VClone(*(undefined8 *)((long)cvode_mem + 0xe0));
                  __ptr[0xb] = lVar5;
                  if (lVar5 == 0) {
                    N_VDestroy(__ptr[10]);
                    N_VDestroy(__ptr[0xd]);
                    N_VDestroy(__ptr[0xe]);
                    SUNMatDestroy(__ptr[8]);
                    SUNMatDestroy(__ptr[7]);
                    free(__ptr);
                    msgfmt = "A memory request failed.";
                    iVar2 = -4;
                    line = 0xbe;
                  }
                  else {
                    __ptr[0xc] = 0;
                    lVar5 = N_VClone(*(undefined8 *)((long)cvode_mem + 0xe0));
                    __ptr[0xc] = lVar5;
                    if (lVar5 == 0) {
                      N_VDestroy(__ptr[10]);
                      N_VDestroy(__ptr[0xb]);
                      N_VDestroy(__ptr[0xd]);
                      N_VDestroy(__ptr[0xe]);
                      SUNMatDestroy(__ptr[8]);
                      SUNMatDestroy(__ptr[7]);
                      free(__ptr);
                      msgfmt = "A memory request failed.";
                      iVar2 = -4;
                      line = 0xce;
                    }
                    else {
                      __ptr[9] = 0;
                      p_Var6 = SUNLinSol_Band((N_Vector)__ptr[0xe],(SUNMatrix)__ptr[8],*cvode_mem);
                      __ptr[9] = (long)p_Var6;
                      if (p_Var6 == (SUNLinearSolver)0x0) {
                        N_VDestroy(__ptr[10]);
                        N_VDestroy(__ptr[0xb]);
                        N_VDestroy(__ptr[0xc]);
                        N_VDestroy(__ptr[0xd]);
                        N_VDestroy(__ptr[0xe]);
                        SUNMatDestroy(__ptr[8]);
                        SUNMatDestroy(__ptr[7]);
                        free(__ptr);
                        msgfmt = "A memory request failed.";
                        iVar2 = -4;
                        line = 0xe1;
                      }
                      else {
                        iVar2 = SUNLinSolInitialize(p_Var6);
                        if (iVar2 == 0) {
                          sVar7 = local_50;
                          if (local_50 <= 0.0) {
                            __x = *(double *)((long)cvode_mem + 8);
                            sVar7 = 0.0;
                            if (0.0 < __x) {
                              if (__x < 0.0) {
                                sVar7 = sqrt(__x);
                              }
                              else {
                                sVar7 = SQRT(__x);
                              }
                            }
                          }
                          __ptr[4] = (long)sVar7;
                          __ptr[0xf] = N;
                          __ptr[0x10] = 0;
                          __ptr[0x11] = 0;
                          if (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0xe0) + 8) + 0x20) !=
                              0) {
                            N_VSpace(*(long *)((long)cvode_mem + 0xe0),&lrw1,&liw1);
                            __ptr[0x10] = __ptr[0x10] + lrw1 * 3;
                            __ptr[0x11] = __ptr[0x11] + liw1 * 3;
                          }
                          if (*(long *)(*(long *)(__ptr[0xe] + 8) + 0x20) != 0) {
                            N_VSpace(__ptr[0xe],&lrw1,&liw1);
                            __ptr[0x10] = __ptr[0x10] + lrw1 * 2;
                            __ptr[0x11] = __ptr[0x11] + liw1 * 2;
                          }
                          if (*(long *)(*(long *)(__ptr[7] + 8) + 0x50) != 0) {
                            SUNMatSpace(__ptr[7],&lrw,&liw);
                            __ptr[0x10] = __ptr[0x10] + lrw;
                            __ptr[0x11] = __ptr[0x11] + liw;
                          }
                          if (*(long *)(*(long *)(__ptr[8] + 8) + 0x50) != 0) {
                            SUNMatSpace(__ptr[8],&lrw,&liw);
                            __ptr[0x10] = __ptr[0x10] + lrw;
                            __ptr[0x11] = __ptr[0x11] + liw;
                          }
                          if (*(long *)(*(long *)(__ptr[9] + 8) + 0x60) != 0) {
                            SUNLinSolSpace(__ptr[9],&lrw,&liw);
                            __ptr[0x10] = __ptr[0x10] + lrw;
                            __ptr[0x11] = __ptr[0x11] + liw;
                          }
                          __ptr[0x12] = 0;
                          if (*(code **)(lVar1 + 0xe8) != (code *)0x0) {
                            (**(code **)(lVar1 + 0xe8))(cvode_mem);
                          }
                          *(long **)(lVar1 + 0xf0) = __ptr;
                          *(code **)(lVar1 + 0xe8) = CVBBDPrecFree;
                          iVar2 = CVodeSetPreconditioner(cvode_mem,CVBBDPrecSetup,CVBBDPrecSolve);
                          return iVar2;
                        }
                        N_VDestroy(__ptr[10]);
                        N_VDestroy(__ptr[0xb]);
                        N_VDestroy(__ptr[0xc]);
                        N_VDestroy(__ptr[0xd]);
                        N_VDestroy(__ptr[0xe]);
                        SUNMatDestroy(__ptr[8]);
                        SUNMatDestroy(__ptr[7]);
                        SUNLinSolFree(__ptr[9]);
                        free(__ptr);
                        msgfmt = "An error arose from a SUNBandLinearSolver routine.";
                        iVar2 = -9;
                        line = 0xf4;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  cvProcessError((CVodeMem)cvode_mem,iVar2,line,"CVBBDPrecInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVBBDPrecInit(void* cvode_mem, sunindextype Nlocal, sunindextype mudq,
                  sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                  sunrealtype dqrely, CVLocalFn gloc, CVCommFn cfn)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if the CVLS linear solver interface has been created */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  if (cv_mem->cv_tempv->ops->nvgetarraypointer == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBBD_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (CVBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Set pointers to gloc and cfn; load half-bandwidths */
  pdata->cvode_mem = cvode_mem;
  pdata->gloc      = gloc;
  pdata->cfn       = cfn;
  pdata->mudq      = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq      = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk              = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk              = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep    = muk;
  pdata->mlkeep    = mlk;

  /* Allocate memory for saved Jacobian */
  pdata->savedJ = SUNBandMatrixStorage(Nlocal, muk, mlk, muk, cv_mem->cv_sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for preconditioner matrix */
  storage_mu    = SUNMIN(Nlocal - 1, muk + mlk);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                       cv_mem->cv_sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNewEmpty_Serial(Nlocal, cv_mem->cv_sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, cv_mem->cv_sunctx);
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp1 = NULL;
  pdata->tmp1 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp1 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp2 = NULL;
  pdata->tmp2 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp2 == NULL)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp3 = NULL;
  pdata->tmp3 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp3 == NULL)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->rlocal, pdata->savedP, cv_mem->cv_sunctx);
  if (pdata->LS == NULL)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    N_VDestroy(pdata->tmp3);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    N_VDestroy(pdata->tmp3);
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                   MSGBBD_SUNLS_FAIL);
    return (CVLS_SUNLS_FAIL);
  }

  /* Set pdata->dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(cv_mem->cv_uround);

  /* Store Nlocal to be used in CVBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (cv_mem->cv_tempv->ops->nvspace)
  {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    pdata->rpwsize += 3 * lrw1;
    pdata->ipwsize += 3 * liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += 2 * lrw1;
    pdata->ipwsize += 2 * liw1;
  }
  if (pdata->savedJ->ops->space)
  {
    flag = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->savedP->ops->space)
  {
    flag = SUNMatSpace(pdata->savedP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure P_data is free from any previous allocations */
  if (cvls_mem->pfree) { cvls_mem->pfree(cv_mem); }

  /* Point to the new P_data field in the LS memory */
  cvls_mem->P_data = pdata;

  /* Attach the pfree function */
  cvls_mem->pfree = CVBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = CVodeSetPreconditioner(cvode_mem, CVBBDPrecSetup, CVBBDPrecSolve);
  return (flag);
}